

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

string * __thiscall
CLI::FailureMessage::simple_abi_cxx11_
          (string *__return_storage_ptr__,FailureMessage *this,App *app,Error *e)

{
  int iVar1;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  iVar1 = (*app->_vptr_App[2])(app);
  ::std::__cxx11::string::string
            ((string *)&local_70,(char *)CONCAT44(extraout_var,iVar1),(allocator *)&local_50);
  ::std::operator+(__return_storage_ptr__,&local_70,"\n");
  ::std::__cxx11::string::~string((string *)&local_70);
  if (*(Option **)(this + 0xd0) != (Option *)0x0) {
    Option::single_name_abi_cxx11_(&local_30,*(Option **)(this + 0xd0));
    ::std::operator+(&local_50,"Run with ",&local_30);
    ::std::operator+(&local_70,&local_50," for more information.\n");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string simple(const App *app, const Error &e) {
    std::string header = std::string(e.what()) + "\n";
    if(app->get_help_ptr() != nullptr)
        header += "Run with " + app->get_help_ptr()->single_name() + " for more information.\n";
    return header;
}